

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::CharSet<char16_t>::GetNextRange
          (CharSet<char16_t> *this,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  CharSetNode *pCVar1;
  bool bVar2;
  char16 cVar3;
  Char CVar4;
  uint uVar5;
  uint uVar6;
  char16 local_5c;
  Char local_5a;
  int local_58;
  Char tempHighChar;
  Char tempLowChar;
  int nextClear;
  int nextSet;
  bool found;
  Char nextChar_1;
  ulong uStack_48;
  Char nextChar;
  size_t compactLength;
  uint i;
  Char singleton;
  Char *pCStack_30;
  int count;
  Char *outHigherChar_local;
  Char *outLowerChar_local;
  CharSet<char16_t> *pCStack_18;
  Char searchCharStart_local;
  CharSet<char16_t> *this_local;
  
  pCStack_30 = outHigherChar;
  outHigherChar_local = outLowerChar;
  outLowerChar_local._6_2_ = searchCharStart;
  pCStack_18 = this;
  i = Count(this);
  if (i == 0) {
    this_local._7_1_ = false;
  }
  else if (i == 1) {
    cVar3 = Singleton(this);
    if ((ushort)cVar3 < (ushort)outLowerChar_local._6_2_) {
      this_local._7_1_ = false;
    }
    else {
      *pCStack_30 = cVar3;
      *outHigherChar_local = cVar3;
      this_local._7_1_ = true;
    }
  }
  else {
    bVar2 = IsCompact(this);
    if (bVar2) {
      Sort(this);
      compactLength._4_4_ = 0;
      uVar5 = GetCompactLength(this);
      uStack_48 = (ulong)uVar5;
      for (; compactLength._4_4_ < uStack_48; compactLength._4_4_ = compactLength._4_4_ + 1) {
        nextSet._2_2_ = GetCompactChar(this,compactLength._4_4_);
        if ((ushort)outLowerChar_local._6_2_ <= (ushort)nextSet._2_2_) {
          *pCStack_30 = nextSet._2_2_;
          *outHigherChar_local = nextSet._2_2_;
          break;
        }
      }
      if (compactLength._4_4_ == uStack_48) {
        this_local._7_1_ = false;
      }
      else {
        while (compactLength._4_4_ = compactLength._4_4_ + 1, compactLength._4_4_ < uStack_48) {
          nextSet._0_2_ = GetCompactChar(this,compactLength._4_4_);
          if ((uint)(ushort)(Char)nextSet != (ushort)*pCStack_30 + 1) {
            return true;
          }
          *pCStack_30 = *pCStack_30 + L'\x01';
        }
        this_local._7_1_ = true;
      }
    }
    else {
      nextClear._3_1_ = 0;
      uVar5 = Chars<char16_t>::CTU(outLowerChar_local._6_2_);
      if ((uVar5 < 0x100) &&
         (_tempHighChar =
               CharBitvec::NextSet(&(this->rep).full.direct,(uint)(ushort)outLowerChar_local._6_2_),
         _tempHighChar != -1)) {
        nextClear._3_1_ = 1;
        *outHigherChar_local = (Char)_tempHighChar;
        local_58 = CharBitvec::NextClear(&(this->rep).full.direct,_tempHighChar);
        if (local_58 != -1) {
          CVar4 = Chars<char16_t>::UTC(local_58 - 1);
          *pCStack_30 = CVar4;
          return true;
        }
        *pCStack_30 = L'ÿ';
        local_58 = 0xffffffff;
      }
      if ((this->rep).compact.countPlusOne == 0) {
        this_local._7_1_ = (bool)(nextClear._3_1_ & 1);
      }
      else {
        local_5a = L'\0';
        local_5c = L'\0';
        if ((nextClear._3_1_ & 1) == 0) {
          if ((ushort)outLowerChar_local._6_2_ < 0x101) {
            outLowerChar_local._6_2_ = L'Ā';
          }
        }
        else {
          outLowerChar_local._6_2_ = *pCStack_30 + L'\x01';
        }
        pCVar1 = (this->rep).full.root;
        uVar6 = (*pCVar1->_vptr_CharSetNode[0xc])
                          (pCVar1,2,(ulong)(ushort)outLowerChar_local._6_2_,&local_5a,&local_5c);
        if (((uVar6 & 1) == 0) ||
           (((nextClear._3_1_ & 1) != 0 && ((uint)(ushort)local_5a != (ushort)*pCStack_30 + 1)))) {
          this_local._7_1_ = (bool)(nextClear._3_1_ & 1);
        }
        else {
          if ((nextClear._3_1_ & 1) == 0) {
            *outHigherChar_local = local_5a;
          }
          *pCStack_30 = local_5c;
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CharSet<char16>::GetNextRange(Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar)
    {
        int count = this->Count();
        if (count == 0)
        {
            return false;
        }
        else if (count == 1)
        {
            Char singleton = this->Singleton();
            if (singleton < searchCharStart)
            {
                return false;
            }

            *outLowerChar = *outHigherChar = singleton;

            return true;
        }

        if (IsCompact())
        {
            this->Sort();
            uint i = 0;
            size_t compactLength = this->GetCompactLength();
            for (; i < compactLength; i++)
            {
                Char nextChar = this->GetCompactChar(i);
                if (nextChar >= searchCharStart)
                {
                    *outLowerChar = *outHigherChar = nextChar;
                    break;
                }
            }

            if (i == compactLength)
            {
                return false;
            }

            i++;

            for (; i < compactLength; i++)
            {
                Char nextChar = this->GetCompactChar(i);
                if (nextChar != *outHigherChar + 1)
                {
                    return true;
                }
                *outHigherChar += 1;
            }

            return true;
        }
        else
        {
            bool found = false;
            if (CTU(searchCharStart) < CharSetNode::directSize)
            {
                int nextSet = rep.full.direct.NextSet(searchCharStart);

                if (nextSet != -1)
                {
                    found = true;

                    *outLowerChar = (char16)nextSet;

                    int nextClear = rep.full.direct.NextClear(nextSet);

                    if (nextClear != -1)
                    {
                        *outHigherChar = UTC(nextClear - 1);
                        return true;
                    }

                    *outHigherChar = CharSetNode::directSize - 1;
                }
            }

            if (rep.full.root == nullptr)
            {
                return found;
            }
            Char tempLowChar = 0, tempHighChar = 0;

            if (found)
            {
                searchCharStart = *outHigherChar + 1;
            }
            else
            {
                searchCharStart = searchCharStart > CharSetNode::directSize ? searchCharStart : CharSetNode::directSize;
            }

            if (rep.full.root->GetNextRange(CharSetNode::levels - 1, searchCharStart, &tempLowChar, &tempHighChar) && (!found || tempLowChar == *outHigherChar + 1))
            {
                if (!found)
                {
                    *outLowerChar = tempLowChar;
                }
                *outHigherChar = tempHighChar;
                return true;
            }

            return found;
        }
    }